

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

int __thiscall ON_wString::ReverseFind(ON_wString *this,wchar_t *s)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  bool bVar3;
  int element_count1;
  int iVar4;
  wchar_t *pwStack_38;
  wchar_t w0;
  wchar_t *p;
  wchar_t *p0;
  int this_len;
  int s_len;
  wchar_t *s_local;
  ON_wString *this_local;
  
  element_count1 = Length(s);
  iVar4 = Length(this);
  if ((element_count1 < 1) || (iVar4 < element_count1)) {
LAB_00996cba:
    this_local._4_4_ = -1;
  }
  else {
    pwVar2 = this->m_s;
    pwStack_38 = pwVar2 + ((iVar4 - element_count1) + 1);
    wVar1 = *s;
    do {
      if (pwStack_38 <= pwVar2) goto LAB_00996cba;
      pwStack_38 = pwStack_38 + -1;
    } while ((wVar1 != *pwStack_38) ||
            (bVar3 = EqualOrdinal(pwStack_38,element_count1,s,element_count1,false), !bVar3));
    this_local._4_4_ = (int)((long)pwStack_38 - (long)pwVar2 >> 2);
  }
  return this_local._4_4_;
}

Assistant:

int ON_wString::ReverseFind(const wchar_t* s) const
{
  const int s_len = ON_wString::Length(s);
  const int this_len = Length();
  if (s_len > 0 && s_len <= this_len )
  {
    const wchar_t* p0 = m_s;
    const wchar_t* p = p0 + (this_len - s_len + 1);
    const wchar_t w0 = s[0];
    while (p > p0)
    {
      p--;
      if ( w0 == p[0] && ON_wString::EqualOrdinal(p,s_len,s,s_len,false) )
        return ((int)(p - p0));
    }
  }
  return -1;
}